

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap_algorithm.hpp
# Opt level: O0

void __thiscall
ranges::detail::sift_down_n_fn::operator()
          (sift_down_n_fn *this,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,
          iter_difference_t<__gnu_cxx::__normal_iterator<int_*,_std::vector<int>_>_> len,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> start,
          reference_wrapper<ranges::less> pred,reference_wrapper<ranges::identity> proj)

{
  int iVar1;
  type_conflict1 tVar2;
  difference_type dVar3;
  reference piVar4;
  int *piVar5;
  int *piVar6;
  type_conflict1 local_85;
  type_conflict1 local_69;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_68;
  int *local_60;
  int local_54;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Stack_50;
  iter_value_t<__gnu_cxx::__normal_iterator<int_*,_std::vector<int>_>_> top;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_48;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> child_i;
  difference_type child;
  iter_difference_t<__gnu_cxx::__normal_iterator<int_*,_std::vector<int>_>_> len_local;
  sift_down_n_fn *this_local;
  reference_wrapper<ranges::identity> proj_local;
  reference_wrapper<ranges::less> pred_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> start_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first_local;
  
  this_local = (sift_down_n_fn *)proj._M_data;
  proj_local._M_data = (identity *)pred._M_data;
  pred_local._M_data = (less *)start._M_current;
  start_local = first;
  dVar3 = __gnu_cxx::operator-
                    ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     &pred_local,&start_local);
  if ((1 < len) && (dVar3 <= (len + -2) / 2)) {
    child_i._M_current = (int *)(dVar3 * 2 + 1);
    local_48 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator+(&start_local,(difference_type)child_i._M_current);
    local_69 = false;
    if ((long)child_i._M_current + 1 < len) {
      piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_48);
      piVar5 = invoke_fn::operator()
                         ((invoke_fn *)&invoke,(reference_wrapper<ranges::identity> *)&this_local,
                          piVar4);
      _Stack_50 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                  operator+(&local_48,1);
      piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&stack0xffffffffffffffb0);
      piVar6 = invoke_fn::operator()
                         ((invoke_fn *)&invoke,(reference_wrapper<ranges::identity> *)&this_local,
                          piVar4);
      local_69 = invoke_fn::operator()
                           ((invoke_fn *)&invoke,(reference_wrapper<ranges::less> *)&proj_local,
                            piVar5,piVar6);
    }
    if (local_69 != false) {
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_48);
      child_i._M_current = child_i._M_current + 1;
    }
    piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_48);
    piVar5 = invoke_fn::operator()
                       ((invoke_fn *)&invoke,(reference_wrapper<ranges::identity> *)&this_local,
                        piVar4);
    piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                        &pred_local);
    piVar6 = invoke_fn::operator()
                       ((invoke_fn *)&invoke,(reference_wrapper<ranges::identity> *)&this_local,
                        piVar4);
    tVar2 = invoke_fn::operator()
                      ((invoke_fn *)&invoke,(reference_wrapper<ranges::less> *)&proj_local,piVar5,
                       piVar6);
    if (!tVar2) {
      piVar5 = _iter_move_::fn::operator()
                         ((fn *)&_::iter_move,
                          (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                          &pred_local);
      local_54 = *piVar5;
      do {
        piVar5 = _iter_move_::fn::operator()((fn *)&_::iter_move,&local_48);
        iVar1 = *piVar5;
        piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           &pred_local);
        *piVar4 = iVar1;
        pred_local._M_data = (less *)local_48._M_current;
        if ((len + -2) / 2 < (long)child_i._M_current) break;
        child_i._M_current = (int *)((long)child_i._M_current * 2 + 1);
        local_60 = (int *)__gnu_cxx::
                          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                          operator+(&start_local,(difference_type)child_i._M_current);
        local_85 = false;
        local_48 = (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)local_60;
        if ((long)child_i._M_current + 1 < len) {
          piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_48);
          piVar5 = invoke_fn::operator()
                             ((invoke_fn *)&invoke,
                              (reference_wrapper<ranges::identity> *)&this_local,piVar4);
          local_68 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator+(&local_48,1);
          piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_68);
          piVar6 = invoke_fn::operator()
                             ((invoke_fn *)&invoke,
                              (reference_wrapper<ranges::identity> *)&this_local,piVar4);
          local_85 = invoke_fn::operator()
                               ((invoke_fn *)&invoke,(reference_wrapper<ranges::less> *)&proj_local,
                                piVar5,piVar6);
        }
        if (local_85 != false) {
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_48);
          child_i._M_current = child_i._M_current + 1;
        }
        piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(&local_48);
        piVar5 = invoke_fn::operator()
                           ((invoke_fn *)&invoke,(reference_wrapper<ranges::identity> *)&this_local,
                            piVar4);
        piVar6 = invoke_fn::operator()
                           ((invoke_fn *)&invoke,(reference_wrapper<ranges::identity> *)&this_local,
                            &local_54);
        tVar2 = invoke_fn::operator()
                          ((invoke_fn *)&invoke,(reference_wrapper<ranges::less> *)&proj_local,
                           piVar5,piVar6);
      } while (((tVar2 ^ 0xffU) & 1) != 0);
      iVar1 = local_54;
      piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         &pred_local);
      *piVar4 = iVar1;
    }
  }
  return;
}

Assistant:

void operator()(I first, iter_difference_t<I> len, I start, C pred = C{},
                            P proj = P{}) const
            {
                // left-child of start is at 2 * start + 1
                // right-child of start is at 2 * start + 2
                auto child = start - first;

                if(len < 2 || (len - 2) / 2 < child)
                    return;

                child = 2 * child + 1;
                I child_i = first + child;

                if((child + 1) < len &&
                   invoke(pred, invoke(proj, *child_i), invoke(proj, *(child_i + 1))))
                {
                    // right-child exists and is greater than left-child
                    ++child_i;
                    ++child;
                }

                // check if we are in heap-order
                if(invoke(pred, invoke(proj, *child_i), invoke(proj, *start)))
                    // we are, start is larger than it's largest child
                    return;

                iter_value_t<I> top = iter_move(start);
                do
                {
                    // we are not in heap-order, swap the parent with it's largest child
                    *start = iter_move(child_i);
                    start = child_i;

                    if((len - 2) / 2 < child)
                        break;

                    // recompute the child based off of the updated parent
                    child = 2 * child + 1;
                    child_i = first + child;

                    if((child + 1) < len &&
                       invoke(pred, invoke(proj, *child_i), invoke(proj, *(child_i + 1))))
                    {
                        // right-child exists and is greater than left-child
                        ++child_i;
                        ++child;
                    }

                    // check if we are in heap-order
                } while(!invoke(pred, invoke(proj, *child_i), invoke(proj, top)));
                *start = std::move(top);
            }